

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularString::GeneratePrivateMembers
          (SingularString *this,Printer *p)

{
  allocator<char> local_f9;
  char *local_f8;
  string local_f0;
  Sub local_d0;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Str",&local_f9);
  local_f8 = "ArenaStringPtr";
  if ((this->super_FieldGeneratorBase).is_inlined_ != false) {
    local_f8 = "InlinedStringField";
  }
  io::Printer::Sub::Sub<char_const*>(&local_d0,&local_f0,&local_f8);
  google::protobuf::io::Printer::Emit
            (p,&local_d0,1,0x31,"\n              $pbi$::$Str$ $name$_;\n            ");
  io::Printer::Sub::~Sub(&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  return;
}

Assistant:

void GeneratePrivateMembers(io::Printer* p) const override {
    // Skips the automatic destruction if inlined; rather calls it explicitly if
    // allocating arena is null.
    p->Emit({{"Str", is_inlined() ? "InlinedStringField" : "ArenaStringPtr"}},
            R"cc(
              $pbi$::$Str$ $name$_;
            )cc");
  }